

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_defaults_dangles(int d)

{
  int iVar1;
  int iVar2;
  int d_local;
  
  if ((d < 0) || (iVar1 = d, iVar2 = d, 3 < d)) {
    vrna_message_warning
              (
              "vrna_md_defaults_dangles@model.c: Dangles out of range, must be (0 <= d <= 3). Not changing anything!"
              );
    iVar1 = dangles;
    iVar2 = defaults.dangles;
  }
  defaults.dangles = iVar2;
  dangles = iVar1;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_dangles(int d)
{
  if ((d >= 0) && (d <= 3)) {
    defaults.dangles = d;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
    dangles = d;
#endif
  } else {
    vrna_message_warning(
      "vrna_md_defaults_dangles@model.c: Dangles out of range, must be (0 <= d <= 3). Not changing anything!");
  }
}